

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O3

int lzham::lzham_lib_z_deflateInit2
              (lzham_z_streamp pStream,int level,int method,int window_bits,int mem_level,
              int strategy)

{
  lzham_z_internal_state *plVar1;
  lzham_uint32 lVar2;
  uint uVar3;
  int iVar4;
  lzham_compress_params local_48;
  
  if (pStream == (lzham_z_streamp)0x0) {
    return -2;
  }
  if (mem_level - 10U < 0xfffffff7) {
    return -10000;
  }
  if ((method != 0xe) && (method != 8)) {
    return -10000;
  }
  uVar3 = 9;
  if (level != -1) {
    uVar3 = level;
  }
  if (method == 8) {
    window_bits = 0xf;
  }
  local_48.m_dict_size_log2 = -window_bits;
  if (0 < window_bits) {
    local_48.m_dict_size_log2 = window_bits;
  }
  if (local_48.m_dict_size_log2 - 0x1e < 0xfffffff1) {
    return -10000;
  }
  local_48.m_compress_flags = 0;
  local_48.m_table_max_update_interval = 0;
  local_48.m_table_update_interval_slow_rate = 0;
  local_48.m_extreme_parsing_max_best_arrivals = 0;
  local_48.m_fast_bytes = 0;
  local_48.m_num_seed_bytes = 0;
  local_48._28_4_ = 0;
  local_48.m_pSeed_bytes = (void *)0x0;
  local_48.m_struct_size = 0x38;
  local_48.m_level = LZHAM_COMP_LEVEL_UBER;
  local_48.m_table_update_rate = 0;
  if ((int)uVar3 < 2) {
    local_48.m_level = LZHAM_COMP_LEVEL_FASTEST;
    local_48.m_table_update_rate = 0;
  }
  else if (uVar3 < 4) {
    local_48.m_level = LZHAM_COMP_LEVEL_FASTER;
    local_48.m_table_update_rate = 0;
  }
  else if (uVar3 < 6) {
    local_48.m_level = LZHAM_COMP_LEVEL_DEFAULT;
    local_48.m_table_update_rate = 0;
  }
  else {
    if (7 < uVar3) {
      lVar2 = 0x20;
      if (uVar3 == 10) {
        local_48.m_compress_flags = 2;
        lVar2 = 0x22;
      }
      goto LAB_0010634e;
    }
    local_48.m_level = LZHAM_COMP_LEVEL_BETTER;
    local_48.m_table_update_rate = 0;
  }
  lVar2 = 0x20;
LAB_0010634e:
  if (0 < window_bits) {
    local_48.m_compress_flags = lVar2;
  }
  local_48.m_max_helper_threads = -1;
  pStream->data_type = 0;
  pStream->adler = 1;
  iVar4 = 0;
  pStream->reserved = 0;
  pStream->total_in = 0;
  pStream->total_out = 0;
  pStream->msg = (char *)0x0;
  plVar1 = (lzham_z_internal_state *)lzham_lib_compress_init(&local_48);
  if (plVar1 == (lzham_z_internal_state *)0x0) {
    iVar4 = -10000;
  }
  else {
    pStream->state = plVar1;
  }
  return iVar4;
}

Assistant:

int lzham_lib_z_deflateInit2(lzham_z_streamp pStream, int level, int method, int window_bits, int mem_level, int strategy)
   {
      LZHAM_NOTE_UNUSED(strategy);

      if (!pStream)
      {
         LZHAM_LOG_ERROR(6029);
         return LZHAM_Z_STREAM_ERROR;
      }
      if ((mem_level < 1) || (mem_level > 9))
      {
         LZHAM_LOG_ERROR(6030);
         return LZHAM_Z_PARAM_ERROR;
      }
      if ((method != LZHAM_Z_DEFLATED) && (method != LZHAM_Z_LZHAM))
      {
         LZHAM_LOG_ERROR(6031);
         return LZHAM_Z_PARAM_ERROR;
      }

      if (level == LZHAM_Z_DEFAULT_COMPRESSION)
         level = 9;

      if (method == LZHAM_Z_DEFLATED)
      {
         // Force Deflate to LZHAM with default window_bits.
         method = LZHAM_Z_LZHAM;
         window_bits = LZHAM_Z_DEFAULT_WINDOW_BITS;
      }

#ifdef LZHAM_Z_API_FORCE_WINDOW_BITS
      window_bits = LZHAM_Z_API_FORCE_WINDOW_BITS;
#endif

      int max_window_bits = LZHAM_64BIT_POINTERS ? LZHAM_MAX_DICT_SIZE_LOG2_X64 : LZHAM_MAX_DICT_SIZE_LOG2_X86;
      if ((labs(window_bits) < LZHAM_MIN_DICT_SIZE_LOG2) || (labs(window_bits) > max_window_bits))
      {
         LZHAM_LOG_ERROR(6032);
         return LZHAM_Z_PARAM_ERROR;
      }

      lzham_compress_params comp_params;

      utils::zero_object(comp_params);
      comp_params.m_struct_size = sizeof(lzham_compress_params);

      comp_params.m_level = LZHAM_COMP_LEVEL_UBER;
      if (level <= 1)
         comp_params.m_level = LZHAM_COMP_LEVEL_FASTEST;
      else if (level <= 3)
         comp_params.m_level = LZHAM_COMP_LEVEL_FASTER;
      else if (level <= 5)
         comp_params.m_level = LZHAM_COMP_LEVEL_DEFAULT;
      else if (level <= 7)
         comp_params.m_level = LZHAM_COMP_LEVEL_BETTER;

      if (level == 10)
         comp_params.m_compress_flags |= LZHAM_COMP_FLAG_EXTREME_PARSING;

      // Use all CPU's. TODO: This is not always the best idea depending on the dictionary size and the # of bytes to compress.
      comp_params.m_max_helper_threads = -1;

      comp_params.m_dict_size_log2 = static_cast<lzham_uint32>(labs(window_bits));

      if (window_bits > 0)
         comp_params.m_compress_flags |= LZHAM_COMP_FLAG_WRITE_ZLIB_STREAM;

      pStream->data_type = 0;
      pStream->adler = LZHAM_Z_ADLER32_INIT;
      pStream->msg = NULL;
      pStream->reserved = 0;
      pStream->total_in = 0;
      pStream->total_out = 0;

      lzham_compress_state_ptr pComp = lzham_lib_compress_init(&comp_params);
      if (!pComp)
      {
         LZHAM_LOG_ERROR(6033);
         return LZHAM_Z_PARAM_ERROR;
      }

      pStream->state = (struct lzham_z_internal_state *)pComp;

      return LZHAM_Z_OK;
   }